

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O2

Result __thiscall spectest::CommandRunner::Run(CommandRunner *this,Script *script)

{
  pointer puVar1;
  Command *base;
  Result RVar2;
  ModuleCommand *command_00;
  AssertModuleCommand<(wabt::CommandType)4> *command_01;
  AssertTrapCommandBase<(wabt::CommandType)9> *command_02;
  RegisterCommand *command_03;
  AssertModuleCommand<(wabt::CommandType)3> *command_04;
  AssertReturnCommand *command_05;
  ActionCommandBase<(wabt::CommandType)1> *command_06;
  AssertModuleCommand<(wabt::CommandType)5> *command_07;
  AssertModuleCommand<(wabt::CommandType)6> *command_08;
  AssertTrapCommandBase<(wabt::CommandType)8> *command_09;
  CommandPtr *command;
  pointer puVar3;
  
  std::__cxx11::string::_M_assign((string *)&this->source_filename_);
  puVar3 = (script->commands).
           super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (script->commands).
           super__Vector_base<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>,_std::allocator<std::unique_ptr<spectest::Command,_std::default_delete<spectest::Command>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar3 == puVar1) {
      return (Result)Ok;
    }
    base = (puVar3->_M_t).
           super___uniq_ptr_impl<spectest::Command,_std::default_delete<spectest::Command>_>._M_t.
           super__Tuple_impl<0UL,_spectest::Command_*,_std::default_delete<spectest::Command>_>.
           super__Head_base<0UL,_spectest::Command_*,_false>._M_head_impl;
    switch(base->type) {
    case First:
      command_00 = wabt::cast<spectest::ModuleCommand,spectest::Command>(base);
      OnModuleCommand(this,command_00);
      goto switchD_00185d91_default;
    case Action:
      command_06 = wabt::cast<spectest::ActionCommandBase<(wabt::CommandType)1>,spectest::Command>
                             (base);
      RVar2 = OnActionCommand(this,command_06);
      break;
    case Register:
      command_03 = wabt::cast<spectest::RegisterCommand,spectest::Command>(base);
      OnRegisterCommand(this,command_03);
      goto switchD_00185d91_default;
    case AssertMalformed:
      command_04 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)3>,spectest::Command>
                             (base);
      RVar2 = OnAssertMalformedCommand(this,command_04);
      break;
    case AssertInvalid:
      command_01 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)4>,spectest::Command>
                             (base);
      RVar2 = OnAssertInvalidCommand(this,command_01);
      break;
    case AssertUnlinkable:
      command_07 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)5>,spectest::Command>
                             (base);
      RVar2 = OnAssertUnlinkableCommand(this,command_07);
      break;
    case AssertUninstantiable:
      command_08 = wabt::cast<spectest::AssertModuleCommand<(wabt::CommandType)6>,spectest::Command>
                             (base);
      RVar2 = OnAssertUninstantiableCommand(this,command_08);
      break;
    case AssertReturn:
      command_05 = wabt::cast<spectest::AssertReturnCommand,spectest::Command>(base);
      RVar2 = OnAssertReturnCommand(this,command_05);
      break;
    case AssertTrap:
      command_09 = wabt::
                   cast<spectest::AssertTrapCommandBase<(wabt::CommandType)8>,spectest::Command>
                             (base);
      RVar2 = OnAssertTrapCommand(this,command_09);
      break;
    case AssertExhaustion:
      command_02 = wabt::
                   cast<spectest::AssertTrapCommandBase<(wabt::CommandType)9>,spectest::Command>
                             (base);
      RVar2 = OnAssertExhaustionCommand(this,command_02);
      break;
    default:
      goto switchD_00185d91_default;
    }
    if (RVar2.enum_ == Ok) {
      this->passed_ = this->passed_ + 1;
    }
    this->total_ = this->total_ + 1;
switchD_00185d91_default:
    puVar3 = puVar3 + 1;
  } while( true );
}

Assistant:

wabt::Result CommandRunner::Run(const Script& script) {
  source_filename_ = script.filename;

  for (const CommandPtr& command : script.commands) {
    switch (command->type) {
      case CommandType::Module:
        OnModuleCommand(cast<ModuleCommand>(command.get()));
        break;

      case CommandType::Action:
        TallyCommand(OnActionCommand(cast<ActionCommand>(command.get())));
        break;

      case CommandType::Register:
        OnRegisterCommand(cast<RegisterCommand>(command.get()));
        break;

      case CommandType::AssertMalformed:
        TallyCommand(OnAssertMalformedCommand(
            cast<AssertMalformedCommand>(command.get())));
        break;

      case CommandType::AssertInvalid:
        TallyCommand(
            OnAssertInvalidCommand(cast<AssertInvalidCommand>(command.get())));
        break;

      case CommandType::AssertUnlinkable:
        TallyCommand(OnAssertUnlinkableCommand(
            cast<AssertUnlinkableCommand>(command.get())));
        break;

      case CommandType::AssertUninstantiable:
        TallyCommand(OnAssertUninstantiableCommand(
            cast<AssertUninstantiableCommand>(command.get())));
        break;

      case CommandType::AssertReturn:
        TallyCommand(
            OnAssertReturnCommand(cast<AssertReturnCommand>(command.get())));
        break;

      case CommandType::AssertTrap:
        TallyCommand(
            OnAssertTrapCommand(cast<AssertTrapCommand>(command.get())));
        break;

      case CommandType::AssertExhaustion:
        TallyCommand(OnAssertExhaustionCommand(
            cast<AssertExhaustionCommand>(command.get())));
        break;
    }
  }

  return wabt::Result::Ok;
}